

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Literal * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::makeGCData
          (Literal *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,Literals *data
          ,Type type)

{
  HeapType type_00;
  shared_ptr<wasm::GCData> local_50;
  HeapType local_40;
  shared_ptr<wasm::GCData> allocation;
  Literals *data_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  Type type_local;
  
  allocation.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)data;
  this_local = (ExpressionRunner<wasm::ModuleRunner> *)type.id;
  type_local.id = (uintptr_t)__return_storage_ptr__;
  local_40 = wasm::Type::getHeapType((Type *)&this_local);
  std::make_shared<wasm::GCData,wasm::HeapType,wasm::Literals>
            ((HeapType *)&stack0xffffffffffffffc8,(Literals *)&stack0xffffffffffffffc0);
  std::shared_ptr<wasm::GCData>::shared_ptr
            (&local_50,(shared_ptr<wasm::GCData> *)&stack0xffffffffffffffc8);
  type_00 = wasm::Type::getHeapType((Type *)&this_local);
  wasm::Literal::Literal(__return_storage_ptr__,&local_50,type_00);
  std::shared_ptr<wasm::GCData>::~shared_ptr(&local_50);
  std::shared_ptr<wasm::GCData>::~shared_ptr((shared_ptr<wasm::GCData> *)&stack0xffffffffffffffc8);
  return __return_storage_ptr__;
}

Assistant:

Literal makeGCData(Literals&& data, Type type) {
    auto allocation =
      std::make_shared<GCData>(type.getHeapType(), std::move(data));
#if __has_feature(leak_sanitizer) || __has_feature(address_sanitizer)
    // GC data with cycles will leak, since shared_ptrs do not handle cycles.
    // Binaryen is generally not used in long-running programs so we just ignore
    // such leaks for now.
    // TODO: Add a cycle collector?
    __lsan_ignore_object(allocation.get());
#endif
    return Literal(allocation, type.getHeapType());
  }